

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_write_hello_verify_request(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  byte *pbVar2;
  uchar *cookie_len_byte;
  uchar *p;
  mbedtls_ssl_context *pmStack_18;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  cookie_len_byte = ssl->out_msg + 4;
  pmStack_18 = ssl;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
             ,0x804,"=> write hello verify request");
  mbedtls_ssl_write_version
            (pmStack_18->major_ver,pmStack_18->minor_ver,
             *(uint *)&pmStack_18->conf->field_0x164 >> 1 & 1,cookie_len_byte);
  mbedtls_debug_print_buf
            (pmStack_18,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
             ,0x811,"server version",cookie_len_byte,2);
  puVar1 = cookie_len_byte;
  pbVar2 = cookie_len_byte + 2;
  if (pmStack_18->conf->f_cookie_write ==
      (_func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *)0x0) {
    cookie_len_byte = pbVar2;
    mbedtls_debug_print_msg
              (pmStack_18,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x817,"inconsistent cookie callbacks");
    ssl_local._4_4_ = -0x6c00;
  }
  else {
    cookie_len_byte = cookie_len_byte + 3;
    p._4_4_ = (*pmStack_18->conf->f_cookie_write)
                        (pmStack_18->conf->p_cookie,&cookie_len_byte,pmStack_18->out_buf + 0x414d,
                         pmStack_18->cli_id,pmStack_18->cli_id_len);
    if (p._4_4_ == 0) {
      *pbVar2 = (char)cookie_len_byte - ((char)pbVar2 + '\x01');
      mbedtls_debug_print_buf
                (pmStack_18,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x828,"cookie sent",puVar1 + 3,(ulong)*pbVar2);
      pmStack_18->out_msglen = (long)cookie_len_byte - (long)pmStack_18->out_msg;
      pmStack_18->out_msgtype = 0x16;
      *pmStack_18->out_msg = '\x03';
      pmStack_18->state = 0x12;
      p._4_4_ = mbedtls_ssl_write_record(pmStack_18);
      if (p._4_4_ == 0) {
        mbedtls_debug_print_msg
                  (pmStack_18,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,0x836,"<= write hello verify request");
        ssl_local._4_4_ = 0;
      }
      else {
        mbedtls_debug_print_ret
                  (pmStack_18,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,0x832,"mbedtls_ssl_write_record",p._4_4_);
        ssl_local._4_4_ = p._4_4_;
      }
    }
    else {
      mbedtls_debug_print_ret
                (pmStack_18,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x822,"f_cookie_write",p._4_4_);
      ssl_local._4_4_ = p._4_4_;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_write_hello_verify_request( mbedtls_ssl_context *ssl )
{
    int ret;
    unsigned char *p = ssl->out_msg + 4;
    unsigned char *cookie_len_byte;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write hello verify request" ) );

    /*
     * struct {
     *   ProtocolVersion server_version;
     *   opaque cookie<0..2^8-1>;
     * } HelloVerifyRequest;
     */

    /* The RFC is not clear on this point, but sending the actual negotiated
     * version looks like the most interoperable thing to do. */
    mbedtls_ssl_write_version( ssl->major_ver, ssl->minor_ver,
                       ssl->conf->transport, p );
    MBEDTLS_SSL_DEBUG_BUF( 3, "server version", p, 2 );
    p += 2;

    /* If we get here, f_cookie_check is not null */
    if( ssl->conf->f_cookie_write == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "inconsistent cookie callbacks" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    /* Skip length byte until we know the length */
    cookie_len_byte = p++;

    if( ( ret = ssl->conf->f_cookie_write( ssl->conf->p_cookie,
                                     &p, ssl->out_buf + MBEDTLS_SSL_BUFFER_LEN,
                                     ssl->cli_id, ssl->cli_id_len ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "f_cookie_write", ret );
        return( ret );
    }

    *cookie_len_byte = (unsigned char)( p - ( cookie_len_byte + 1 ) );

    MBEDTLS_SSL_DEBUG_BUF( 3, "cookie sent", cookie_len_byte + 1, *cookie_len_byte );

    ssl->out_msglen  = p - ssl->out_msg;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST;

    ssl->state = MBEDTLS_SSL_SERVER_HELLO_VERIFY_REQUEST_SENT;

    if( ( ret = mbedtls_ssl_write_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_write_record", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write hello verify request" ) );

    return( 0 );
}